

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

void __thiscall
chaiscript::Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
          (Boxed_Value *this,Dynamic_Object *t,bool t_return_value)

{
  Dynamic_Object local_78;
  byte local_19;
  Dynamic_Object *pDStack_18;
  bool t_return_value_local;
  Dynamic_Object *t_local;
  Boxed_Value *this_local;
  
  local_19 = t_return_value;
  pDStack_18 = t;
  t_local = (Dynamic_Object *)this;
  dispatch::Dynamic_Object::Dynamic_Object(&local_78,t);
  Object_Data::get<chaiscript::dispatch::Dynamic_Object>
            ((Object_Data *)this,&local_78,(bool)(local_19 & 1));
  dispatch::Dynamic_Object::~Dynamic_Object(&local_78);
  return;
}

Assistant:

explicit Boxed_Value(T &&t, bool t_return_value = false)
        : m_data(Object_Data::get(std::forward<T>(t), t_return_value)) {
    }